

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O0

FreePageEntry * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ZeroPageQueue::PopZeroPageEntry(ZeroPageQueue *this)

{
  FreePageEntry *pFVar1;
  FreePageEntry *head;
  AutoCriticalSection autoCS;
  ZeroPageQueue *this_local;
  
  autoCS.cs = (CriticalSection *)this;
  AutoCriticalSection::AutoCriticalSection
            ((AutoCriticalSection *)&head,
             &(this->super_BackgroundPageQueue).backgroundPageQueueCriticalSection);
  pFVar1 = this->pendingZeroPageList;
  if (pFVar1 != (FreePageEntry *)0x0) {
    this->pendingZeroPageList = this->pendingZeroPageList->Next;
  }
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&head);
  return pFVar1;
}

Assistant:

FreePageEntry* PopZeroPageEntry()
        {
#if SUPPORT_WIN32_SLIST
            return (FreePageEntry *)::InterlockedPopEntrySList(&pendingZeroPageList);
#else
            AutoCriticalSection autoCS(&this->backgroundPageQueueCriticalSection);
            FreePageEntry* head = pendingZeroPageList;
            if (head)
            {
                pendingZeroPageList = pendingZeroPageList->Next;
            }
            return head;
#endif
        }